

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O2

TokenList * scanTokens(void)

{
  TokenList *pTVar1;
  byte bVar2;
  int iVar3;
  byte *pbVar4;
  TokenList *pTVar5;
  byte *pbVar6;
  TokenList *pTVar7;
  TokenList *pTVar8;
  TokenType TVar9;
  uint uVar10;
  TokenType *pTVar11;
  byte *pbVar12;
  uint uVar13;
  int iVar14;
  long lVar15;
  uint local_3c;
  
  pbVar6 = scanner_2;
  pTVar5 = (TokenList *)0x0;
  uVar10 = scanner_3;
  pTVar1 = (TokenList *)0x0;
LAB_001023df:
  pTVar8 = pTVar1;
  pTVar7 = pTVar5;
  bVar2 = *pbVar6;
LAB_001023e1:
  while( true ) {
    pbVar12 = pbVar6;
    iVar14 = (int)pbVar12;
    scanner_1 = pbVar12;
    if (bVar2 == 0) goto LAB_00102987;
    pbVar6 = pbVar12 + 1;
    scanner_2 = pbVar6;
    local_3c = uVar10;
    if ((bVar2 == 0x5f) || (0xe5 < (byte)((bVar2 & 0xdf) + 0xa5))) break;
    if (0xf5 < (byte)(bVar2 - 0x3a)) {
      pbVar6 = pbVar12 + 2;
      while (pbVar4 = pbVar6, 0xf5 < (byte)(pbVar4[-1] - 0x3a)) {
        scanner_2 = pbVar4;
        pbVar6 = pbVar4 + 1;
      }
      pbVar6 = pbVar4 + -1;
      if (pbVar4[-1] == 0x2e) {
        bVar2 = *pbVar4;
        while (0xf5 < (byte)(bVar2 - 0x3a)) {
          pbVar4 = pbVar6 + 1;
          pbVar6 = pbVar6 + 1;
          scanner_2 = pbVar6;
          bVar2 = *pbVar4;
        }
      }
      iVar14 = (int)pbVar6 - iVar14;
      TVar9 = TOKEN_NUMBER;
      goto LAB_0010290b;
    }
    switch(bVar2) {
    case 0x20:
      for (uVar13 = 1; (bVar2 = *pbVar6, bVar2 == 0x20 && (uVar13 < 4)); uVar13 = uVar13 + 1) {
        pbVar6 = pbVar6 + 1;
      }
      scanner_2 = pbVar6;
      if (uVar13 == 4) {
        iVar14 = 4;
LAB_00102837:
        TVar9 = TOKEN_INDENT;
        pbVar6 = scanner_2;
        goto LAB_0010290b;
      }
      break;
    case 0x21:
      if (pbVar12[1] == 0x3d) {
        pbVar6 = pbVar12 + 2;
        iVar14 = 2;
        TVar9 = TOKEN_BANG_EQUAL;
        scanner_2 = pbVar6;
      }
      else {
        iVar14 = 1;
        TVar9 = TOKEN_BANG;
      }
      goto LAB_0010290b;
    case 0x22:
      goto LAB_00102720;
    case 0x23:
    case 0x24:
    case 0x26:
    case 0x27:
    case 0x30:
    case 0x31:
    case 0x32:
    case 0x33:
    case 0x34:
    case 0x35:
    case 0x36:
    case 0x37:
    case 0x38:
    case 0x39:
switchD_00102435_caseD_23:
      printf("\x1b[31m\n[Error] [Line:%d] Unexpected character %c!\x1b[0m",(ulong)uVar10,
             (ulong)(uint)(int)(char)bVar2);
      se = se + 1;
      iVar14 = (int)scanner_2;
      pbVar12 = scanner_1;
      uVar10 = scanner_3;
      goto LAB_00102987;
    case 0x25:
      iVar14 = 1;
      TVar9 = TOKEN_PERCEN;
      goto LAB_0010290b;
    case 0x28:
      TVar9 = TOKEN_LEFT_PAREN;
      iVar14 = 1;
      goto LAB_0010290b;
    case 0x29:
      TVar9 = TOKEN_RIGHT_PAREN;
      iVar14 = 1;
      goto LAB_0010290b;
    case 0x2a:
      iVar14 = 1;
      TVar9 = TOKEN_STAR;
      goto LAB_0010290b;
    case 0x2b:
      iVar14 = 1;
      TVar9 = TOKEN_PLUS;
      goto LAB_0010290b;
    case 0x2c:
      iVar14 = 1;
      TVar9 = TOKEN_COMMA;
      goto LAB_0010290b;
    case 0x2d:
      iVar14 = 1;
      TVar9 = TOKEN_MINUS;
      goto LAB_0010290b;
    case 0x2e:
      iVar14 = 1;
      TVar9 = TOKEN_DOT;
      goto LAB_0010290b;
    case 0x2f:
      iVar14 = 1;
      TVar9 = TOKEN_SLASH;
      goto LAB_0010290b;
    case 0x3a:
      iVar14 = 1;
      TVar9 = TOKEN_COLON;
      goto LAB_0010290b;
    case 0x3b:
      iVar14 = 1;
      TVar9 = TOKEN_SEMICOLON;
      goto LAB_0010290b;
    case 0x3c:
      if (pbVar12[1] == 0x3d) {
        pbVar6 = pbVar12 + 2;
        iVar14 = 2;
        TVar9 = TOKEN_LESS_EQUAL;
        scanner_2 = pbVar6;
      }
      else {
        iVar14 = 1;
        TVar9 = TOKEN_LESS;
      }
      goto LAB_0010290b;
    case 0x3d:
      if (pbVar12[1] == 0x3d) {
        pbVar6 = pbVar12 + 2;
        iVar14 = 2;
        TVar9 = TOKEN_EQUAL_EQUAL;
        scanner_2 = pbVar6;
      }
      else {
        iVar14 = 1;
        TVar9 = TOKEN_EQUAL;
      }
      goto LAB_0010290b;
    case 0x3e:
      if (pbVar12[1] == 0x3d) {
        pbVar6 = pbVar12 + 2;
        iVar14 = 2;
        TVar9 = TOKEN_GREATER_EQUAL;
        scanner_2 = pbVar6;
      }
      else {
        iVar14 = 1;
        TVar9 = TOKEN_GREATER;
      }
      goto LAB_0010290b;
    default:
      if (bVar2 == 0xd) goto code_r0x0010245d;
      if (bVar2 == 9) {
        iVar14 = 1;
        goto LAB_00102837;
      }
      if (bVar2 == 10) {
        iVar14 = 1;
        goto LAB_00102894;
      }
      if (bVar2 == 0x5b) {
        iVar14 = 1;
        TVar9 = TOKEN_LEFT_SQUARE;
      }
      else if (bVar2 == 0x5d) {
        iVar14 = 1;
        TVar9 = TOKEN_RIGHT_SQUARE;
      }
      else if (bVar2 == 0x5e) {
        iVar14 = 1;
        TVar9 = TOKEN_CARET;
      }
      else if (bVar2 == 0x7b) {
        iVar14 = 1;
        TVar9 = TOKEN_LEFT_BRACE;
      }
      else {
        if (bVar2 != 0x7d) goto switchD_00102435_caseD_23;
        iVar14 = 1;
        TVar9 = TOKEN_RIGHT_BRACE;
      }
      goto LAB_0010290b;
    }
  }
  lVar15 = 0;
  while (((bVar2 = pbVar12[lVar15 + 1], bVar2 == 0x5f || (0xf5 < (byte)(bVar2 - 0x3a))) ||
         (0xe5 < (byte)((bVar2 & 0xdf) + 0xa5)))) {
    scanner_2 = pbVar12 + lVar15 + 2;
    lVar15 = lVar15 + 1;
  }
  pTVar11 = &keywords[0].type;
  while( true ) {
    pbVar6 = pbVar12 + lVar15 + 1;
    if (((Keyword *)(pTVar11 + -4))->name == (char *)0x0) break;
    if ((*(size_t *)(pTVar11 + -2) - 1 == lVar15) &&
       (iVar3 = bcmp(pbVar12,((Keyword *)(pTVar11 + -4))->name,lVar15 + 1U), iVar3 == 0)) {
      TVar9 = *pTVar11;
      if (TVar9 != TOKEN_EOF) {
        iVar14 = (int)(lVar15 + 1U);
        goto LAB_0010290b;
      }
      iVar14 = iVar14 + (int)lVar15 + 1;
LAB_00102987:
      pTVar5 = (TokenList *)malloc(0x28);
      (pTVar5->value).type = TOKEN_EOF;
      (pTVar5->value).start = (char *)pbVar12;
      (pTVar5->value).length = iVar14 - (int)pbVar12;
      (pTVar5->value).line = uVar10;
      pTVar5->next = (TokenList *)0x0;
      if (pTVar8 != (TokenList *)0x0) {
        pTVar7->next = pTVar5;
        pTVar5 = pTVar8;
      }
      return pTVar5;
    }
    pTVar11 = pTVar11 + 6;
  }
  iVar14 = (int)lVar15 + 1;
  TVar9 = TOKEN_IDENTIFIER;
  goto LAB_0010290b;
code_r0x0010245d:
  bVar2 = *pbVar6;
  if (bVar2 == 10) goto LAB_00102871;
  goto LAB_001023e1;
LAB_00102871:
  pbVar6 = pbVar12 + 2;
  iVar14 = 2;
LAB_00102894:
  local_3c = uVar10 + 1;
  scanner_3 = uVar10 + 1;
  TVar9 = TOKEN_NEWLINE;
  scanner_2 = pbVar6;
LAB_0010290b:
  pTVar5 = (TokenList *)malloc(0x28);
  pTVar5->next = (TokenList *)0x0;
  (pTVar5->value).type = TVar9;
  (pTVar5->value).start = (char *)pbVar12;
  (pTVar5->value).length = iVar14;
  (pTVar5->value).line = local_3c;
  uVar10 = local_3c;
  pTVar1 = pTVar5;
  if (pTVar8 != (TokenList *)0x0) {
    pTVar7->next = pTVar5;
    pTVar1 = pTVar8;
  }
  goto LAB_001023df;
LAB_00102720:
  bVar2 = *pbVar6;
  if (bVar2 == 10) {
    uVar10 = uVar10 + 1;
    scanner_3 = uVar10;
  }
  else if (bVar2 == 0x5c) {
    if (pbVar6[1] == 0x22) {
      pbVar6 = pbVar6 + 1;
    }
  }
  else {
    local_3c = uVar10;
    if (bVar2 == 0) {
      iVar14 = 0x14;
      TVar9 = TOKEN_ERROR;
      pbVar12 = (byte *)"Unterminated string.";
      scanner_2 = pbVar6;
      goto LAB_0010290b;
    }
    if (bVar2 == 0x22) goto LAB_001028c8;
  }
  pbVar6 = pbVar6 + 1;
  goto LAB_00102720;
LAB_001028c8:
  pbVar6 = pbVar6 + 1;
  iVar14 = (int)pbVar6 - iVar14;
  TVar9 = TOKEN_STRING;
  scanner_2 = pbVar6;
  goto LAB_0010290b;
}

Assistant:

TokenList* scanTokens(){
    TokenList *ret = NULL, *head = NULL;
    Token t;
    while((t = scanToken()).type != TOKEN_EOF){
        //info("Looping in makelist");
        insertList(&head, &ret, newList(t));
    }

    insertList(&head, &ret, newList(makeToken(TOKEN_EOF)));

    return head;
}